

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

vm_strbuf_ext *
vm_strbuf_ext::expand_ext(CVmObjStringBuffer *self,vm_strbuf_ext *old_ext,int32_t new_len)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar4;
  vm_strbuf_ext *pvVar3;
  
  pvVar3 = old_ext;
  if (old_ext->alo < new_len) {
    iVar1 = old_ext->inc;
    iVar4 = new_len + iVar1 + -1;
    iVar4 = iVar4 - iVar4 % iVar1;
    iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                      (G_mem_X->varheap_,(long)(iVar4 * 4 + 0xc),self);
    pvVar3 = (vm_strbuf_ext *)CONCAT44(extraout_var,iVar2);
    pvVar3->alo = iVar4;
    pvVar3->inc = iVar1;
    pvVar3->len = 0;
    pvVar3->len = old_ext->len;
    memcpy(pvVar3->buf,old_ext->buf,(long)old_ext->len << 2);
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,old_ext);
  }
  return pvVar3;
}

Assistant:

vm_strbuf_ext *vm_strbuf_ext::expand_ext(VMG_ CVmObjStringBuffer *self,
                                         vm_strbuf_ext *old_ext,
                                         int32_t new_len)
{
    /* if the buffer is big enough to hold the new length, we're done */
    if (old_ext->alo >= new_len)
        return old_ext;

    /* 
     *   figure the required new allocation size: we allocate in increments
     *   of 'inc' from the old extension, so allocate enough for the new
     *   length, rounded up 
     */
    int32_t new_alo = ((new_len + old_ext->inc - 1) / old_ext->inc)
                      * old_ext->inc;
    vm_strbuf_ext *new_ext = alloc_ext(vmg_ self, new_alo, old_ext->inc);

    /* copy the current string buffer to the new extension */
    new_ext->len = old_ext->len;
    memcpy(new_ext->buf, old_ext->buf,
           old_ext->len * sizeof(old_ext->buf[0]));

    /* delete the old memory */
    G_mem->get_var_heap()->free_mem(old_ext);

    /* return the new extension */
    return new_ext;
}